

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int len;
  int iVar11;
  ulong uVar12;
  float *pfVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_18a;
  char local_189;
  uchar rgbe [4];
  uchar scanlineheader [4];
  undefined8 local_160;
  float local_158;
  uint local_154;
  uint local_150;
  int local_14c;
  uint local_148;
  uint local_144;
  long local_140;
  long local_138;
  float *local_130;
  ulong local_128;
  long local_120;
  long local_118;
  long local_110;
  char header [66];
  char buffer [128];
  
  iVar2 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    uVar12 = (ulong)(uint)x;
    local_130 = data;
    __ptr = malloc((ulong)(uint)(x * 4));
    builtin_strncpy(header,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n",
                    0x42);
    (*s->func)(s->context,header,0x41);
    iVar2 = sprintf(buffer,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    uVar12);
    (*s->func)(s->context,buffer,iVar2);
    local_14c = comp * x;
    local_154 = x - 0x8000;
    local_150 = (uint)x >> 8;
    uVar10 = (ulong)(uint)x;
    local_120 = (long)__ptr + uVar10;
    uVar14 = comp - 3;
    local_140 = (long)comp << 2;
    local_118 = (ulong)(uint)(x * 3) + (long)__ptr;
    local_138 = (ulong)(uint)(x * 2) + (long)__ptr;
    uVar7 = 0;
    local_148 = y;
    local_144 = uVar14;
    while (lVar4 = local_138, uVar6 = (uint)uVar7, uVar6 != local_148) {
      uVar3 = ~uVar6 + local_148;
      if (stbi__flip_vertically_on_write == 0) {
        uVar3 = uVar6;
      }
      pfVar13 = local_130 + (int)(uVar3 * local_14c);
      scanlineheader[2] = (uchar)local_150;
      scanlineheader[0] = '\x02';
      scanlineheader[1] = '\x02';
      scanlineheader[3] = (uchar)x;
      uVar8 = uVar10;
      local_128 = uVar7;
      if (local_154 < 0xffff8008) {
        while (uVar8 != 0) {
          if (uVar14 < 2) {
            local_158 = pfVar13[2];
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)pfVar13;
          }
          else {
            local_158 = *pfVar13;
            auVar15._4_4_ = local_158;
            auVar15._0_4_ = local_158;
            auVar15._8_4_ = local_158;
            auVar15._12_4_ = local_158;
          }
          local_160 = vmovlps_avx(auVar15);
          stbiw__linear_to_rgbe(rgbe,(float *)&local_160);
          (*s->func)(s->context,rgbe,4);
          pfVar13 = (float *)((long)pfVar13 + local_140);
          uVar8 = uVar8 - 1;
        }
      }
      else {
        for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
          if (uVar14 < 2) {
            local_158 = pfVar13[2];
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)pfVar13;
          }
          else {
            local_158 = *pfVar13;
            auVar16._4_4_ = local_158;
            auVar16._0_4_ = local_158;
            auVar16._8_4_ = local_158;
            auVar16._12_4_ = local_158;
          }
          local_160 = vmovlps_avx(auVar16);
          stbiw__linear_to_rgbe(rgbe,(float *)&local_160);
          pfVar13 = (float *)((long)pfVar13 + local_140);
          *(uchar *)((long)__ptr + uVar7) = rgbe[0];
          *(uchar *)(local_120 + uVar7) = rgbe[1];
          *(uchar *)(lVar4 + uVar7) = rgbe[2];
          *(uchar *)(local_118 + uVar7) = rgbe[3];
        }
        (*s->func)(s->context,scanlineheader,4);
        lVar4 = 0;
        pvVar5 = __ptr;
        while (lVar4 != 4) {
          lVar9 = lVar4 * uVar10;
          uVar14 = 0;
          local_110 = lVar4;
          while ((int)uVar14 < x) {
            uVar6 = uVar14;
            for (lVar4 = (long)(int)uVar14 + 2;
                (uVar7 = uVar12, lVar4 < (long)uVar10 &&
                ((cVar1 = *(char *)((long)pvVar5 + lVar4 + -2),
                 cVar1 != *(char *)((long)pvVar5 + lVar4 + -1) ||
                 (uVar7 = (ulong)uVar6, cVar1 != *(char *)((long)pvVar5 + lVar4)))));
                lVar4 = lVar4 + 1) {
              uVar6 = uVar6 + 1;
            }
            while( true ) {
              iVar2 = (int)uVar7;
              iVar11 = iVar2 - uVar14;
              if (iVar11 == 0 || iVar2 < (int)uVar14) break;
              if (0x7f < iVar11) {
                iVar11 = 0x80;
              }
              local_18a = (undefined1)iVar11;
              (*s->func)(s->context,&local_18a,1);
              (*s->func)(s->context,(void *)((long)__ptr + (int)uVar14 + lVar9),iVar11);
              uVar14 = uVar14 + iVar11;
            }
            if (iVar2 + 2 < x) {
              for (uVar7 = (ulong)iVar2;
                  (uVar8 = uVar12, (long)uVar7 < (long)uVar10 &&
                  (uVar8 = uVar7,
                  *(char *)((long)pvVar5 + uVar7) == *(char *)((long)__ptr + (int)uVar14 + lVar9)));
                  uVar7 = uVar7 + 1) {
              }
              for (; iVar2 = (int)uVar8 - uVar14, iVar2 != 0 && (int)uVar14 <= (int)uVar8;
                  uVar14 = iVar2 + uVar14) {
                if (0x7e < iVar2) {
                  iVar2 = 0x7f;
                }
                local_18a = *(undefined1 *)((long)__ptr + (int)uVar14 + lVar9);
                local_189 = (char)iVar2 + -0x80;
                (*s->func)(s->context,&local_189,1);
                (*s->func)(s->context,&local_18a,1);
              }
            }
          }
          pvVar5 = (void *)((long)pvVar5 + uVar10);
          uVar14 = local_144;
          lVar4 = local_110 + 1;
        }
      }
      uVar7 = (ulong)((int)local_128 + 1);
    }
    free(__ptr);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}